

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O2

Fl_Tree_Item * __thiscall
Fl_Tree_Item::insert_above(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs,char *new_label)

{
  uint uVar1;
  Fl_Tree_Item *pFVar2;
  ulong uVar3;
  ulong uVar4;
  
  pFVar2 = this->_parent;
  if (pFVar2 != (Fl_Tree_Item *)0x0) {
    uVar1 = (pFVar2->_children)._total;
    uVar3 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      if ((pFVar2->_children)._items[uVar3] == this) {
        pFVar2 = insert(pFVar2,prefs,new_label,(int)uVar3);
        return pFVar2;
      }
    }
  }
  return (Fl_Tree_Item *)0x0;
}

Assistant:

Fl_Tree_Item *Fl_Tree_Item::insert_above(const Fl_Tree_Prefs &prefs, const char *new_label) {
  Fl_Tree_Item *p = _parent;
  if ( ! p ) return(0);
  // Walk our parent's children to find ourself
  for ( int t=0; t<p->children(); t++ ) {
    Fl_Tree_Item *c = p->child(t);
    if ( this == c ) {
      return(p->insert(prefs, new_label, t));
    }
  }
  return(0);
}